

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

bool __thiscall
GenericModel::dropMimeData
          (GenericModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  bool bVar1;
  undefined1 uVar2;
  DropAction DVar3;
  DropAction action_00;
  QModelIndex *pQVar4;
  
  if (row < 0) {
    row = (**(code **)(*(long *)this + 0x78))(this,parent);
  }
  pQVar4 = (QModelIndex *)0x0;
  if (0 < column) {
    pQVar4 = (QModelIndex *)(ulong)(uint)column;
  }
  bVar1 = QModelIndex::isValid(parent);
  if (bVar1) {
    if (data == (QMimeData *)0x0) {
      return false;
    }
    if ((GenericModel *)parent->m != this) {
      return false;
    }
  }
  else if (data == (QMimeData *)0x0) {
    return false;
  }
  DVar3 = (**(code **)(*(long *)this + 0xe8))(this);
  if ((action & DVar3) == IgnoreAction) {
    return false;
  }
  bVar1 = GenericModelPrivate::decodeMime(this->m_dptr,data,action_00,row,(int)pQVar4,parent);
  if (!bVar1) {
    uVar2 = QAbstractItemModel::dropMimeData((QMimeData *)this,(DropAction)data,action,row,pQVar4);
    return (bool)uVar2;
  }
  return true;
}

Assistant:

bool GenericModel::dropMimeData(const QMimeData *data, Qt::DropAction action, int row, int column, const QModelIndex &parent)
{
    if (row < 0)
        row = rowCount(parent);
    if (column < 0)
        column = 0;
    if (parent.isValid() && parent.model() != this)
        return false;
    if (!data)
        return false;
    if (!(action & supportedDropActions()))
        return false;
    Q_D(GenericModel);
    if (d->decodeMime(data, action, row, column, parent))
        return true;
    return QAbstractItemModel::dropMimeData(data, action, row, column, parent);
}